

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CThreadSynchronizationInfo::InitializePreCreate(CThreadSynchronizationInfo *this)

{
  ThreadNativeWaitData *__mutex;
  pthread_cond_t *__cond;
  int iVar1;
  SHMPTR shmptr;
  undefined4 *puVar2;
  PAL_ERROR PVar3;
  int iVar4;
  int iVar5;
  
  shmptr = SHMalloc(4);
  this->m_shridWaitAwakened = shmptr;
  if (shmptr == 0) {
    PVar3 = 8;
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_001dc2ce:
      abort();
    }
  }
  else {
    puVar2 = (undefined4 *)SHMPtrToPtr(shmptr);
    if (puVar2 == (undefined4 *)0x0) {
      fprintf(_stderr,"] %s %s:%d","InitializePreCreate",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0xeee);
      fprintf(_stderr,
              "Expression: NULL != pdwWaitState, Description: Unable to map shared wait state: bad shrared id[shrid=%p]\n"
              ,this->m_shridWaitAwakened);
    }
    *puVar2 = 0;
    this->m_tsThreadState = TS_STARTING;
    __mutex = &this->m_tnwdNativeData;
    iVar1 = pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
    if (iVar1 != 0) {
      iVar4 = 10;
      do {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001dc2ce;
        strerror(iVar1);
        if (iVar1 != 0xb) {
          if (iVar1 == 0xc) {
            PVar3 = 8;
          }
          else {
LAB_001dc300:
            PVar3 = 0x54f;
          }
          goto LAB_001dc323;
        }
        if (iVar4 + 10 == 0x78) goto LAB_001dc300;
        iVar1 = iVar4;
        if (99 < iVar4) {
          iVar1 = 100;
        }
        poll((pollfd *)0x0,0,iVar1);
        iVar1 = pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
        iVar4 = iVar4 + 10;
      } while (iVar1 != 0);
    }
    __cond = &(this->m_tnwdNativeData).cond;
    iVar1 = pthread_cond_init((pthread_cond_t *)__cond,(pthread_condattr_t *)0x0);
    if (iVar1 != 0) {
      iVar4 = 10;
      do {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001dc2ce;
        strerror(iVar1);
        if (iVar1 != 0xb) {
          if (iVar1 != 0xc) goto LAB_001dc312;
          PVar3 = 8;
LAB_001dc317:
          pthread_mutex_destroy((pthread_mutex_t *)__mutex);
          goto LAB_001dc323;
        }
        iVar5 = iVar4 + 10;
        if (iVar5 == 0x78) {
LAB_001dc312:
          PVar3 = 0x54f;
          goto LAB_001dc317;
        }
        if (99 < iVar4) {
          iVar4 = 100;
        }
        poll((pollfd *)0x0,0,iVar4);
        iVar1 = pthread_cond_init((pthread_cond_t *)__cond,(pthread_condattr_t *)0x0);
        iVar4 = iVar5;
      } while (iVar1 != 0);
    }
    (this->m_tnwdNativeData).fInitialized = true;
    PVar3 = 0;
  }
LAB_001dc323:
  if (PVar3 != 0) {
    this->m_tsThreadState = TS_FAILED;
  }
  return PVar3;
}

Assistant:

PAL_ERROR CThreadSynchronizationInfo::InitializePreCreate(void)
    {
        PAL_ERROR palErr = NO_ERROR;
        DWORD * pdwWaitState = NULL;
        int iRet;
#if !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        const int MaxUnavailableResourceRetries = 10;
        int iEagains;
#else // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        int iPipes[2] = { -1, -1};
#endif // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        m_shridWaitAwakened = RawSharedObjectAlloc(sizeof(DWORD),
                                                   DefaultSharedPool);
        if (NULLSharedID == m_shridWaitAwakened)
        {
            ERROR("Fail allocating thread wait status shared object\n");
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto IPrC_exit;
        }

        pdwWaitState = SharedIDToTypePointer(DWORD,
            m_shridWaitAwakened);

        _ASSERT_MSG(NULL != pdwWaitState,
                    "Unable to map shared wait state: bad shrared id"
                    "[shrid=%p]\n", (VOID*)m_shridWaitAwakened);

        VolatileStore<DWORD>(pdwWaitState, TWS_ACTIVE);
        m_tsThreadState = TS_STARTING;

#if !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        iEagains = 0;
    Mutex_retry:
        iRet = pthread_mutex_init(&m_tnwdNativeData.mutex, NULL);
        if (0 != iRet)
        {
            ERROR("Failed creating thread synchronization mutex "
                  "[error=%d (%s)]\n", iRet, strerror(iRet));
            if (EAGAIN == iRet && MaxUnavailableResourceRetries >= ++iEagains)
            {
                poll(NULL, 0, min(100,10*iEagains));
                goto Mutex_retry;
            }
            else if (ENOMEM == iRet)
            {
                palErr = ERROR_NOT_ENOUGH_MEMORY;
            }
            else
            {
                palErr = ERROR_INTERNAL_ERROR;
            }
            goto IPrC_exit;
        }

        iEagains = 0;
    Cond_retry:
        iRet = pthread_cond_init(&m_tnwdNativeData.cond, NULL);
        if (0 != iRet)
        {
            ERROR("Failed creating thread synchronization condition "
                  "[error=%d (%s)]\n", iRet, strerror(iRet));
            if (EAGAIN == iRet && MaxUnavailableResourceRetries >= ++iEagains)
            {
                poll(NULL, 0, min(100,10*iEagains));
                goto Cond_retry;
            }
            else if (ENOMEM == iRet)
            {
                palErr = ERROR_NOT_ENOUGH_MEMORY;
            }
            else
            {
                palErr = ERROR_INTERNAL_ERROR;
            }
            pthread_mutex_destroy(&m_tnwdNativeData.mutex);
            goto IPrC_exit;
        }

#else // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        iRet = pipe(iPipes);
        if (0 != iRet)
        {
            ERROR("Failed to create pipes to support native wait [errno=%d (%s)]\n",
                  errno, strerror(errno));
            switch(errno)
            {
                case EMFILE:
                case ENFILE:
                    palErr = ERROR_NO_SYSTEM_RESOURCES;
                    break;
                case EFAULT:
                    palErr = ERROR_INVALID_DATA;
                    break;
                default:
                    palErr = ERROR_INTERNAL_ERROR;
                    break;
            }

            goto IPrC_exit;
        }

        if (0 != fcntl(iPipes[0], F_SETFL, O_NONBLOCK) ||
            0 != fcntl(iPipes[1], F_SETFL, O_NONBLOCK))
        {
            ERROR("Failed to set thread-blocking pipes to non-blocking mode "
                  "[errno=%d (%s)]\n", errno, strerror(errno));
            close(iPipes[0]);
            close(iPipes[1]);
            palErr = ERROR_INTERNAL_ERROR;
            goto IPrC_exit;
        }

        m_tnwdNativeData.iPipeRd = iPipes[0];
        m_tnwdNativeData.iPipeWr = iPipes[1];

#endif // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        m_tnwdNativeData.fInitialized = true;

    IPrC_exit:
        if (NO_ERROR != palErr)
        {
            m_tsThreadState = TS_FAILED;
        }
        return palErr;
    }